

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkparser.cpp
# Opt level: O2

void __thiscall
LinkParser::parseStatus
          (LinkParser *this,Link *link,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  pointer pbVar1;
  bool bVar2;
  _func_int **pp_Var3;
  InputError *this_00;
  undefined8 uVar4;
  string *s1;
  string local_70;
  double local_50;
  double setting;
  allocator local_21;
  
  pbVar1 = (tokenList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(tokenList->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1)) {
    std::__cxx11::string::string((string *)&setting,"OPEN",&local_21);
    s1 = pbVar1 + 1;
    bVar2 = Utilities::match(s1,(string *)&setting);
    std::__cxx11::string::~string((string *)&setting);
    if (bVar2) {
      pp_Var3 = (link->super_Element)._vptr_Element;
      uVar4 = 1;
    }
    else {
      std::__cxx11::string::string((string *)&setting,"CLOSED",&local_21);
      bVar2 = Utilities::match(s1,(string *)&setting);
      std::__cxx11::string::~string((string *)&setting);
      if (!bVar2) {
        bVar2 = Utilities::parseNumber<double>(s1,&local_50);
        if (bVar2) {
          (*(link->super_Element)._vptr_Element[0xb])(local_50,link);
          return;
        }
        this_00 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_70,(string *)s1);
        InputError::InputError(this_00,3,&local_70);
        __cxa_throw(this_00,&InputError::typeinfo,ENerror::~ENerror);
      }
      pp_Var3 = (link->super_Element)._vptr_Element;
      uVar4 = 0;
    }
    (*pp_Var3[10])(link,uVar4);
  }
  return;
}

Assistant:

void LinkParser::parseStatus(Link* link, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - link ID
    // 1 - OPEN/CLOSED keyword or numerical setting

    if ( tokenList.size() < 2 ) return;
    string* tokens = &tokenList[0];
    double setting;

    // ... check for OPEN/CLOSED keywords

    if (Utilities::match(tokens[1], "OPEN"))
    {
	    link->setInitStatus(Link::LINK_OPEN);
    }
    else if (Utilities::match(tokens[1], "CLOSED"))
    {
	    link->setInitStatus(Link::LINK_CLOSED);
    }

    // ... check for numerical setting value

    else if (Utilities::parseNumber(tokens[1], setting))
    {
	    link->setInitSetting(setting);
    }
    else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);
}